

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O1

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int ex;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long local_70;
  long local_68;
  
  uVar1 = worker->y;
  uVar13 = uVar1 >> 8;
  iVar12 = (int)(uVar1 >> 8);
  iVar4 = (int)((ulong)to_y >> 8);
  if ((iVar4 < worker->max_ey || iVar12 < worker->max_ey) &&
     (worker->min_ey <= iVar12 || worker->min_ey <= iVar4)) {
    uVar2 = worker->x;
    uVar11 = uVar2 >> 8;
    iVar10 = (int)(uVar2 >> 8);
    uVar6 = uVar2 + (long)iVar10 * -0x100;
    uVar14 = uVar1 + (long)iVar12 * -0x100;
    ex = (int)((ulong)to_x >> 8);
    if (iVar12 != iVar4 || iVar10 != ex) {
      if (to_y == uVar1) {
        gray_set_cell(worker,ex,iVar12);
      }
      else {
        lVar7 = to_y - uVar1;
        if (to_x == uVar2) {
          if (lVar7 < 1) {
            do {
              iVar12 = iVar12 + -1;
              worker->cover = worker->cover - (int)uVar14;
              worker->area = worker->area + (int)uVar14 * (int)uVar6 * -2;
              gray_set_cell(worker,iVar10,iVar12);
              uVar14 = 0x100;
            } while (iVar12 != iVar4);
          }
          else {
            lVar7 = 0x100 - uVar14;
            uVar14 = 0;
            do {
              iVar12 = iVar12 + 1;
              worker->cover = worker->cover + (int)lVar7;
              worker->area = worker->area + (int)lVar7 * (int)uVar6 * 2;
              gray_set_cell(worker,iVar10,iVar12);
              lVar7 = 0x100;
            } while (iVar12 != iVar4);
          }
        }
        else {
          lVar9 = to_x - uVar2;
          if (iVar10 == ex) {
            local_68 = 0;
          }
          else {
            local_68 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
          }
          if (iVar12 == iVar4) {
            local_70 = 0;
          }
          else {
            local_70 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar7),0);
          }
          lVar8 = lVar7 * 0x100;
          lVar5 = lVar9 * uVar14 - uVar6 * lVar7;
          do {
            lVar3 = lVar5 + lVar9 * -0x100;
            iVar10 = (int)uVar6;
            iVar12 = (int)uVar14;
            if ((lVar3 == 0 || lVar5 < lVar9 * 0x100) || 0 < lVar5) {
              if ((lVar3 < 1) && (0 < lVar3 + lVar8)) {
                uVar6 = (ulong)-(local_70 * lVar3) >> 0x38;
                worker->cover = worker->cover + (0x100 - iVar12);
                worker->area = worker->area +
                               (iVar10 + (uint)(byte)((ulong)-(local_70 * lVar3) >> 0x38)) *
                               (0x100 - iVar12);
                uVar13 = (ulong)((int)uVar13 + 1);
                uVar14 = 0;
              }
              else if ((lVar3 + lVar8 == 0 || SCARRY8(lVar3,lVar8) != lVar3 + lVar8 < 0) &&
                      (lVar3 = lVar5 + lVar8, -1 < lVar3)) {
                uVar14 = (ulong)(lVar3 * local_68) >> 0x38;
                iVar12 = (uint)(byte)((ulong)(lVar3 * local_68) >> 0x38) - iVar12;
                worker->cover = worker->cover + iVar12;
                worker->area = worker->area + (iVar10 + 0x100) * iVar12;
                uVar11 = (ulong)((int)uVar11 + 1);
                uVar6 = 0;
              }
              else {
                uVar6 = (ulong)-(local_70 * lVar5) >> 0x38;
                worker->cover = worker->cover - iVar12;
                worker->area = worker->area -
                               (iVar10 + (uint)(byte)((ulong)-(local_70 * lVar5) >> 0x38)) * iVar12;
                lVar3 = lVar5 + lVar9 * 0x100;
                uVar13 = (ulong)((int)uVar13 - 1);
                uVar14 = 0x100;
              }
            }
            else {
              uVar14 = (ulong)(lVar5 * local_68) >> 0x38;
              iVar12 = (uint)(byte)((ulong)(lVar5 * local_68) >> 0x38) - iVar12;
              worker->cover = worker->cover + iVar12;
              worker->area = worker->area + iVar10 * iVar12;
              lVar3 = lVar5 + lVar7 * -0x100;
              uVar11 = (ulong)((int)uVar11 - 1);
              uVar6 = 0x100;
            }
            gray_set_cell(worker,(int)uVar11,(int)uVar13);
            lVar5 = lVar3;
          } while (((int)uVar11 != ex) || ((int)uVar13 != iVar4));
        }
      }
    }
    iVar4 = (int)to_y - ((int)uVar14 + iVar4 * 0x100);
    worker->cover = worker->cover + iVar4;
    worker->area = worker->area + ((int)uVar6 + ((uint)to_x & 0xff)) * iVar4;
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy, fx1, fy1, fx2, fy2;
    TCoord  ex1, ex2, ey1, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = ras.x - SUBPIXELS( ex1 );
    fy1 = ras.y - SUBPIXELS( ey1 );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      ex1 = ex2;
      gray_set_cell( RAS_VAR_ ex1, ey1 );
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      TPos  prod = dx * fy1 - dy * fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod                                   <= 0 &&
                  prod - dx * ONE_PIXEL                  >  0 ) /* left */
        {
          fx2 = 0;
          fy2 = (TPos)FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL                  <= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = (TPos)FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                  prod                  + dy * ONE_PIXEL >= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = (TPos)FT_UDIV( prod, dx );
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                  prod                                   >  0 )    down */
        {
          fx2 = (TPos)FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );
      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = to_x - SUBPIXELS( ex2 );
    fy2 = to_y - SUBPIXELS( ey2 );

    ras.cover += ( fy2 - fy1 );
    ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }